

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgclient.c
# Opt level: O3

int mg_session_run(mg_session *session,char *query,mg_map *params,mg_map *extra_run_information,
                  mg_list **columns,int64_t *qid)

{
  int iVar1;
  mg_value_type mVar2;
  int iVar3;
  mg_value *pmVar4;
  mg_list *pmVar5;
  int64_t iVar6;
  char *pcVar7;
  mg_message *response;
  mg_message *local_40;
  mg_list **local_38;
  
  iVar1 = session->status;
  if (iVar1 == 2) {
    pcVar7 = "bad session";
LAB_00105309:
    mg_session_set_error(session,pcVar7);
    return -0xf;
  }
  if ((iVar1 == 1) && (session->explicit_transaction == 0)) {
    pcVar7 = "already executing a query";
    goto LAB_00105309;
  }
  if (iVar1 == 3) {
    pcVar7 = "fetching results of a query";
    goto LAB_00105309;
  }
  local_38 = columns;
  mg_message_destroy_ca((session->result).message,session->decoder_allocator);
  (session->result).message = (mg_message *)0x0;
  mg_list_destroy_ca((session->result).columns,session->allocator);
  (session->result).columns = (mg_list *)0x0;
  if (params == (mg_map *)0x0) {
    params = &mg_empty_map;
  }
  if ((session->version == 4) &&
     ((extra_run_information == (mg_map *)0x0 || (session->explicit_transaction != 0)))) {
    extra_run_information = &mg_empty_map;
  }
  iVar1 = mg_session_send_run_message(session,query,params,extra_run_information);
  if (iVar1 != 0) goto LAB_001053ba;
  mg_transport_suspend_until_ready_to_read(session->transport);
  iVar1 = mg_session_receive_message(session);
  if ((iVar1 != 0) || (iVar1 = mg_session_read_bolt_message(session,&local_40), iVar1 != 0))
  goto LAB_001053ba;
  if (local_40->type == MG_MESSAGE_TYPE_FAILURE) {
    iVar3 = handle_failure_message(session,(local_40->field_1).failure_v);
    iVar1 = handle_failure(session);
    if (iVar1 == 0) {
      mg_message_destroy_ca(local_40,session->decoder_allocator);
      return iVar3;
    }
    goto LAB_001053ba;
  }
  if (local_40->type == MG_MESSAGE_TYPE_SUCCESS) {
    pmVar4 = mg_map_at((mg_map *)((local_40->field_1).init_v)->client_name,"fields");
    if ((pmVar4 != (mg_value *)0x0) &&
       (mVar2 = mg_value_get_type(pmVar4), mVar2 == MG_VALUE_TYPE_LIST)) {
      pmVar5 = mg_value_list(pmVar4);
      pmVar5 = mg_list_copy_ca(pmVar5,session->allocator);
      (session->result).columns = pmVar5;
      mg_message_destroy_ca(local_40,session->decoder_allocator);
      if ((session->result).columns == (mg_list *)0x0) {
        mg_session_set_error(session,"out of memory");
        return -3;
      }
      if ((session->version != 4) || (session->explicit_transaction == 0)) goto LAB_00105497;
      if (qid != (int64_t *)0x0) {
        pmVar4 = mg_map_at((mg_map *)((local_40->field_1).init_v)->client_name,"qid");
        if ((pmVar4 == (mg_value *)0x0) ||
           (mVar2 = mg_value_get_type(pmVar4), mVar2 != MG_VALUE_TYPE_INTEGER)) goto LAB_00105502;
        iVar6 = mg_value_integer(pmVar4);
        *qid = iVar6;
      }
      session->query_number = session->query_number + 1;
LAB_00105497:
      if (local_38 != (mg_list **)0x0) {
        *local_38 = (session->result).columns;
      }
      session->status = 1;
      return 0;
    }
LAB_00105502:
    mg_message_destroy_ca(local_40,session->decoder_allocator);
    pcVar7 = "invalid response metadata";
  }
  else {
    mg_message_destroy_ca(local_40,session->decoder_allocator);
    pcVar7 = "unexpected message type";
  }
  mg_session_set_error(session,pcVar7);
  iVar1 = -10;
LAB_001053ba:
  mg_session_invalidate(session);
  return iVar1;
}

Assistant:

int mg_session_run(mg_session *session, const char *query, const mg_map *params,
                   const mg_map *extra_run_information, const mg_list **columns,
                   int64_t *qid) {
  if (session->status == MG_SESSION_BAD) {
    mg_session_set_error(session, "bad session");
    return MG_ERROR_BAD_CALL;
  }
  if (!session->explicit_transaction &&
      session->status == MG_SESSION_EXECUTING) {
    mg_session_set_error(session, "already executing a query");
    return MG_ERROR_BAD_CALL;
  }
  if (session->status == MG_SESSION_FETCHING) {
    mg_session_set_error(session, "fetching results of a query");
    return MG_ERROR_BAD_CALL;
  }

  assert(session->status == MG_SESSION_READY ||
         (session->version == 4 && session->explicit_transaction &&
          session->status == MG_SESSION_EXECUTING));

  mg_message_destroy_ca(session->result.message, session->decoder_allocator);
  session->result.message = NULL;
  mg_list_destroy_ca(session->result.columns, session->allocator);
  session->result.columns = NULL;

  if (!params) {
    params = &mg_empty_map;
  }

  // extra field allowed only allowed for Auto-commit Transaction
  // TODO(aandelic): Check if sending extra run information while in Explicit
  // Transaction should result with an error
  if (session->version == 4 &&
      (!extra_run_information || session->explicit_transaction)) {
    extra_run_information = &mg_empty_map;
  }

  int status = 0;
  status = mg_session_send_run_message(session, query, params,
                                       extra_run_information);
  if (status != 0) {
    goto fatal_failure;
  }

  mg_transport_suspend_until_ready_to_read(session->transport);
  status = mg_session_receive_message(session);
  if (status != 0) {
    goto fatal_failure;
  }

  mg_message *response;

  status = mg_session_read_bolt_message(session, &response);
  if (status != 0) {
    goto fatal_failure;
  }

  if (response->type == MG_MESSAGE_TYPE_SUCCESS) {
    const mg_value *columns_tmp =
        mg_map_at(response->success_v->metadata, "fields");
    if (!columns_tmp || mg_value_get_type(columns_tmp) != MG_VALUE_TYPE_LIST) {
      status = MG_ERROR_PROTOCOL_VIOLATION;
      mg_message_destroy_ca(response, session->decoder_allocator);
      mg_session_set_error(session, "invalid response metadata");
      goto fatal_failure;
    }
    session->result.columns =
        mg_list_copy_ca(mg_value_list(columns_tmp), session->allocator);
    mg_message_destroy_ca(response, session->decoder_allocator);
    if (!session->result.columns) {
      mg_session_set_error(session, "out of memory");
      return MG_ERROR_OOM;
    }

    if (session->version == 4 && session->explicit_transaction) {
      if (qid) {
        const mg_value *qid_tmp =
            mg_map_at(response->success_v->metadata, "qid");

        if (!qid_tmp || mg_value_get_type(qid_tmp) != MG_VALUE_TYPE_INTEGER) {
          status = MG_ERROR_PROTOCOL_VIOLATION;
          mg_message_destroy_ca(response, session->decoder_allocator);
          mg_session_set_error(session, "invalid response metadata");
          goto fatal_failure;
        }

        *qid = mg_value_integer(qid_tmp);
      }

      ++session->query_number;
    }

    if (columns) {
      *columns = session->result.columns;
    }

    session->status = MG_SESSION_EXECUTING;
    return 0;
  }

  if (response->type == MG_MESSAGE_TYPE_FAILURE) {
    int failure_status = handle_failure_message(session, response->failure_v);

    status = handle_failure(session);
    if (status != 0) {
      goto fatal_failure;
    }

    mg_message_destroy_ca(response, session->decoder_allocator);
    return failure_status;
  }

  status = MG_ERROR_PROTOCOL_VIOLATION;
  mg_message_destroy_ca(response, session->decoder_allocator);
  mg_session_set_error(session, "unexpected message type");

fatal_failure:
  mg_session_invalidate(session);
  assert(status != 0);
  return status;
}